

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O0

undefined8 toString(ArgInfo *argInfo,string *indent)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  string *in_RDX;
  string *in_RSI;
  undefined8 in_RDI;
  double dVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  size_t pos;
  string replace;
  string desc;
  string name;
  stringstream ss;
  char *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  string local_278 [32];
  string local_258 [32];
  ulong local_238;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [48];
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [104];
  Range *in_stack_fffffffffffffed8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffee8;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::string::string(local_1c0,in_RSI + 0x40);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator=(local_1c0,in_RSI);
  }
  poVar3 = std::operator<<(local_190,in_RDX);
  poVar3 = std::operator<<(poVar3," * ");
  std::operator<<(poVar3,local_1c0);
  std::__cxx11::string::string(local_1f0,in_RSI + 0x60);
  std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::__cxx11::string::~string(local_230);
  local_238 = 0;
  while (local_238 = std::__cxx11::string::find((char *)local_1f0,0x1186ce),
        local_238 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_1f0,local_238,(string *)0x1);
    lVar4 = std::__cxx11::string::size();
    local_238 = lVar4 + local_238;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(local_190," - ");
    poVar3 = std::operator<<(poVar3,local_1f0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,in_RDX);
    std::operator<<(poVar3,"  ");
  }
  poVar3 = std::operator<<(local_190," [key=");
  std::operator<<(poVar3,in_RSI);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(local_190,", units=");
    std::operator<<(poVar3,in_RSI + 0x80);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(local_190,", default=");
    std::operator<<(poVar3,in_RSI + 0x20);
  }
  switch(*(undefined4 *)(in_RSI + 0xa0)) {
  case 0:
    std::operator<<(local_190,", type=bool");
    break;
  case 1:
    std::operator<<(local_190,", type=int");
    break;
  case 2:
    std::operator<<(local_190,", type=float");
    break;
  case 3:
    std::operator<<(local_190,", type=string");
  }
  dVar5 = SoapySDR::Range::minimum((Range *)(in_RSI + 0xa8));
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)SoapySDR::Range::maximum((Range *)(in_RSI + 0xa8));
  if (dVar5 < (double)this) {
    poVar3 = std::operator<<(local_190,", range=");
    toString_abi_cxx11_(in_stack_fffffffffffffed8);
    std::operator<<(poVar3,local_258);
    std::__cxx11::string::~string(local_258);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this);
  if (!bVar1) {
    poVar3 = std::operator<<(local_190,", options=(");
    toString<std::__cxx11::string>(in_stack_fffffffffffffee8);
    poVar3 = std::operator<<(poVar3,local_278);
    std::operator<<(poVar3,")");
    std::__cxx11::string::~string(local_278);
  }
  std::operator<<(local_190,"]");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string toString(const SoapySDR::ArgInfo &argInfo, const std::string indent = "    ")
{
    std::stringstream ss;

    //name, or use key if missing
    std::string name = argInfo.name;
    if (argInfo.name.empty()) name = argInfo.key;
    ss << indent << " * " << name;

    //optional description
    std::string desc = argInfo.description;
    const std::string replace("\n"+indent+"   ");
    for (size_t pos = 0; (pos=desc.find("\n", pos)) != std::string::npos; pos+=replace.size())
    {
        desc.replace(pos, 1, replace);
    }
    if (not desc.empty()) ss << " - " << desc << std::endl << indent << "  ";

    //other fields
    ss << " [key=" << argInfo.key;
    if (not argInfo.units.empty()) ss << ", units=" << argInfo.units;
    if (not argInfo.value.empty()) ss << ", default=" << argInfo.value;

    //type
    switch (argInfo.type)
    {
    case SoapySDR::ArgInfo::BOOL: ss << ", type=bool"; break;
    case SoapySDR::ArgInfo::INT: ss << ", type=int"; break;
    case SoapySDR::ArgInfo::FLOAT: ss << ", type=float"; break;
    case SoapySDR::ArgInfo::STRING: ss << ", type=string"; break;
    }

    //optional range/enumeration
    if (argInfo.range.minimum() < argInfo.range.maximum()) ss << ", range=" << toString(argInfo.range);
    if (not argInfo.options.empty()) ss << ", options=(" << toString(argInfo.options) << ")";

    ss << "]";

    return ss.str();
}